

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O0

void __thiscall RK_Individual::calculaFuncaoObjetivoOtimizado(RK_Individual *this,Graph *g)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  iterator iVar8;
  iterator iVar9;
  reference ppCVar10;
  Vertex *pVVar11;
  Edge *this_00;
  double *pdVar12;
  double *perdas;
  Vertex *no;
  int id;
  int i_1;
  int n_arcos_inserir;
  int n_arc_inseridos;
  int local_2c;
  int i;
  Graph *g_local;
  RK_Individual *this_local;
  
  iVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::begin(&cromossomos);
  iVar9 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::end(&cromossomos);
  std::
  sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,bool(*)(Chromosome*,Chromosome*)>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )iVar8._M_current,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )iVar9._M_current,ordenaPosicaoCromossomo);
  for (local_2c = 0; iVar3 = getNumEdges(this), local_2c < iVar3; local_2c = local_2c + 1) {
    dVar1 = this->weights[local_2c];
    ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                         (&cromossomos,(long)local_2c);
    (*ppCVar10)->weight = dVar1;
  }
  iVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::begin(&cromossomos);
  iVar9 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::end(&cromossomos);
  std::
  sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,bool(*)(Chromosome*,Chromosome*)>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )iVar8._M_current,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )iVar9._M_current,sortChromosome);
  i_1 = 0;
  iVar3 = Graph::getVerticesSize(g);
  iVar4 = Graph::getNumberOfNonModifiable(g);
  no._4_4_ = 0;
  while (i_1 < (iVar3 + -1) - iVar4) {
    ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                         (&cromossomos,(long)no._4_4_);
    pVVar11 = Edge::getOrigin((*ppCVar10)->edge);
    iVar5 = Vertex::getIdTree(pVVar11);
    ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                         (&cromossomos,(long)no._4_4_);
    pVVar11 = Edge::getDestiny((*ppCVar10)->edge);
    iVar6 = Vertex::getIdTree(pVVar11);
    if (iVar5 != iVar6) {
      ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                           (&cromossomos,(long)no._4_4_);
      bVar2 = Edge::isClosed((*ppCVar10)->edge);
      if (!bVar2) {
        ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                             (&cromossomos,(long)no._4_4_);
        pVVar11 = Edge::getOrigin((*ppCVar10)->edge);
        iVar5 = Vertex::getIdTree(pVVar11);
        for (perdas = (double *)Graph::get_verticesList(g); perdas != (double *)0x0;
            perdas = (double *)Vertex::getNext((Vertex *)perdas)) {
          iVar6 = Vertex::getIdTree((Vertex *)perdas);
          if (iVar6 == iVar5) {
            ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                                 (&cromossomos,(long)no._4_4_);
            pVVar11 = Edge::getDestiny((*ppCVar10)->edge);
            iVar6 = Vertex::getIdTree(pVVar11);
            Vertex::setIdTree((Vertex *)perdas,iVar6);
          }
        }
        ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                             (&cromossomos,(long)no._4_4_);
        Edge::setSwitch((*ppCVar10)->edge,true);
        ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                             (&cromossomos,(long)no._4_4_);
        pVVar11 = Edge::getDestiny((*ppCVar10)->edge);
        iVar5 = Vertex::getID(pVVar11);
        ppCVar10 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                             (&cromossomos,(long)no._4_4_);
        pVVar11 = Edge::getOrigin((*ppCVar10)->edge);
        iVar6 = Vertex::getID(pVVar11);
        this_00 = Graph::findEdge(g,iVar5,iVar6);
        Edge::setSwitch(this_00,true);
        i_1 = i_1 + 1;
      }
    }
    no._4_4_ = no._4_4_ + 1;
  }
  Graph::defineFlows(g);
  Graph::evaluateLossesAndFlows(g,1e-08,0);
  pdVar12 = Graph::getLossesReseting(g);
  this->active_loss = *pdVar12;
  this->reactive_loss = pdVar12[1];
  uVar7 = std::isnan(*pdVar12);
  if ((uVar7 & 1) != 0) {
    this->active_loss = 9999999999.0;
  }
  uVar7 = std::isnan(pdVar12[1]);
  if ((uVar7 & 1) != 0) {
    this->reactive_loss = 9999999999.0;
  }
  if (pdVar12 != (double *)0x0) {
    operator_delete(pdVar12,8);
  }
  return;
}

Assistant:

void RK_Individual::calculaFuncaoObjetivoOtimizado(Graph *g){

    /** colocar os cromossomos na ordem correta em que aparecem no grafo antes de associar os pesos **/
    sort(cromossomos.begin(), cromossomos.end(), ordenaPosicaoCromossomo);

    /** copia peso do individio paca cada cromossomo **/
    for(int i=0; i<this->getNumEdges(); i++)
        cromossomos.at(i)->weight = this->weights[i];

    sort(cromossomos.begin(), cromossomos.end(), sortChromosome);

    int n_arc_inseridos = 0, n_arcos_inserir = g->getVerticesSize() - 1 - g->getNumberOfNonModifiable();


    /** percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal) **/
    for(int i=0; n_arc_inseridos<n_arcos_inserir; i++){

        if((cromossomos.at(i)->edge->getOrigin()->getIdTree() != cromossomos.at(i)->edge->getDestiny()->getIdTree()) &&
                cromossomos.at(i)->edge->isClosed() == false){

            int id = cromossomos.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *no = g->get_verticesList(); no != NULL; no = no->getNext()){
                if(no->getIdTree() == id)
                    no->setIdTree(cromossomos.at(i)->edge->getDestiny()->getIdTree());
            }

            cromossomos.at(i)->edge->setSwitch(true);
            g->findEdge(cromossomos.at(i)->edge->getDestiny()->getID(),
                        cromossomos.at(i)->edge->getOrigin()->getID())->setSwitch(true);

            n_arc_inseridos++;
        }

    }


    g->defineFlows();
    g->evaluateLossesAndFlows(1e-8); /** calcula fluxos e perda com erro de 1e-5 **/

    double *perdas = g->getLossesReseting();/** soma as perdas ativas e reativas em todos os arcos e retorna um double* **/

    this->active_loss = perdas[0];
    this->reactive_loss = perdas[1];

    /** no caso de solucoes que possuem configuracao viavel porem sao muito longas **/
    if(isnan(perdas[0]))
        this->active_loss = 9999999999;

    if(isnan(perdas[1]))
        this->reactive_loss = 9999999999;

    delete perdas;
}